

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O3

void __thiscall llbuild::basic::StringList::StringList(StringList *this,BinaryDecoder *decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  char *__dest;
  StringRef contents;
  StringRef local_38;
  
  this->contents = (char *)0x0;
  this->size = 0;
  uVar1 = BinaryDecoder::read32(decoder);
  uVar2 = BinaryDecoder::read32(decoder);
  this->size = CONCAT44(uVar2,uVar1);
  local_38.Data = (char *)0x0;
  local_38.Length = 0;
  BinaryDecoder::readBytes(decoder,CONCAT44(uVar2,uVar1),&local_38);
  __dest = (char *)operator_new__(this->size);
  this->contents = __dest;
  memcpy(__dest,local_38.Data,local_38.Length);
  return;
}

Assistant:

StringList(basic::BinaryDecoder& decoder) {
    decoder.read(size);
    StringRef contents;
    decoder.readBytes(size, contents);
    this->contents = new char[size];
    memcpy(this->contents, contents.data(), contents.size());
  }